

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strarr.h
# Opt level: O2

void __thiscall
StrArr::StrArr(StrArr *this,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *strings)

{
  pointer pbVar1;
  size_t sVar2;
  char **ppcVar3;
  char *pcVar4;
  size_t i;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  lVar5 = (long)(strings->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(strings->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  sVar2 = lVar5 >> 5;
  this->size_ = sVar2;
  lVar7 = 0;
  ppcVar3 = (char **)operator_new__(-(ulong)(sVar2 + 1 >> 0x3d != 0) | sVar2 * 8 + 8);
  (this->array_)._M_t.super___uniq_ptr_impl<char_*,_std::default_delete<char_*[]>_>._M_t.
  super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*[]>_>.
  super__Head_base<0UL,_char_**,_false>._M_head_impl = ppcVar3;
  *(undefined8 *)((long)ppcVar3 + (lVar5 >> 2)) = 0;
  for (uVar6 = 0;
      pbVar1 = (strings->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)((long)(strings->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar6 = uVar6 + 1) {
    pcVar4 = strdup(*(char **)((long)&(pbVar1->_M_dataplus)._M_p + lVar7 * 4));
    *(char **)((long)(this->array_)._M_t.
                     super___uniq_ptr_impl<char_*,_std::default_delete<char_*[]>_>._M_t.
                     super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*[]>_>.
                     super__Head_base<0UL,_char_**,_false>._M_head_impl + lVar7) = pcVar4;
    lVar7 = lVar7 + 8;
  }
  return;
}

Assistant:

explicit StrArr(const std::vector<std::string>& strings)
      : size_(strings.size()), array_(new char*[size_ + 1]) {
    array_[size_] = NULL;
    for (size_t i = 0; i < strings.size(); i++) {
      // Can't use c_str() directly because array_ is not const char*.
      array_[i] = strdup(strings[i].c_str());
    }
  }

  ~StrArr() {
    // unique_ptr frees the array of pointers but not the pointed-to strings.
    for (int i = 0; i < size_; i++) {
      free(array_[i]);
    }
  }